

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_ll_uploadtoblob.c
# Opt level: O2

IOTHUB_CLIENT_RESULT
IoTHubClient_LL_UploadToBlob_InitializeUpload
          (IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE handle,char *destinationFileName,
          char **uploadCorrelationId,char **azureBlobSasUri)

{
  undefined4 in_EAX;
  int iVar1;
  LOGGER_LOG p_Var2;
  STRING_HANDLE handle_00;
  STRING_HANDLE handle_01;
  size_t sVar3;
  uchar *puVar4;
  BUFFER_HANDLE blobBuffer;
  BUFFER_HANDLE response_buff;
  HTTPAPIEX_HANDLE http_api_handle;
  HTTP_HEADERS_HANDLE request_header;
  char *pcVar5;
  STRING_HANDLE handle_02;
  JSON_Value *value;
  JSON_Object *object;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  STRING_HANDLE handle_03;
  STRING_HANDLE handle_04;
  undefined1 auVar10 [16];
  
  auVar10._0_4_ = -(uint)(handle == (IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE)0x0);
  auVar10._4_4_ = -(uint)(destinationFileName == (char *)0x0);
  auVar10._8_4_ = -(uint)(uploadCorrelationId == (char **)0x0);
  auVar10._12_4_ = -(uint)(azureBlobSasUri == (char **)0x0);
  iVar1 = movmskps(in_EAX,auVar10);
  if (iVar1 != 0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                ,"IoTHubClient_LL_UploadToBlob_InitializeUpload",0x389,1,
                "invalid argument detected handle=%p destinationFileName=%p uploadCorrelationId=%p azureBlobSasUri=%p"
                ,handle,destinationFileName,uploadCorrelationId,azureBlobSasUri);
      return IOTHUB_CLIENT_INVALID_ARG;
    }
    return IOTHUB_CLIENT_INVALID_ARG;
  }
  handle_00 = STRING_construct_sprintf
                        ("/devices/%s/files/%s",handle->deviceId,"?api-version=2016-11-14");
  if (handle_00 == (STRING_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                ,"IoTHubClient_LL_UploadToBlob_GetBlobCredentialsFromIoTHub",0x1dc,1,
                "Failure constructing string");
    }
    goto LAB_00128827;
  }
  handle_01 = STRING_construct_sprintf("{ \"blobName\": \"%s\" }",destinationFileName);
  if (handle_01 == (STRING_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                ,"IoTHubClient_LL_UploadToBlob_GetBlobCredentialsFromIoTHub",0x1e5,1,
                "Failure constructing string");
    }
  }
  else {
    sVar3 = STRING_length(handle_01);
    puVar4 = (uchar *)STRING_c_str(handle_01);
    blobBuffer = BUFFER_create(puVar4,sVar3);
    if (blobBuffer == (BUFFER_HANDLE)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                  ,"IoTHubClient_LL_UploadToBlob_GetBlobCredentialsFromIoTHub",0x1f2,1,
                  "unable to create BUFFER");
      }
    }
    else {
      response_buff = BUFFER_new();
      if (response_buff == (BUFFER_HANDLE)0x0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                    ,"IoTHubClient_LL_UploadToBlob_GetBlobCredentialsFromIoTHub",0x1fc,1,
                    "unable to BUFFER_new");
        }
      }
      else {
        http_api_handle = createIotHubHttpApiExHandle(handle);
        if (http_api_handle == (HTTPAPIEX_HANDLE)0x0) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                      ,"IoTHubClient_LL_UploadToBlob_GetBlobCredentialsFromIoTHub",0x204,1,
                      "Failed to create the HTTPAPIEX_HANDLE for Azure IoT Hub");
          }
        }
        else {
          request_header = createIotHubRequestHttpHeaders(handle);
          if (request_header == (HTTP_HEADERS_HANDLE)0x0) {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                        ,"IoTHubClient_LL_UploadToBlob_GetBlobCredentialsFromIoTHub",0x20d,1,
                        "Failed to allocate HTTP headers for IoT Hub connection");
            }
          }
          else {
            if (handle->cred_type - IOTHUB_CREDENTIAL_TYPE_X509 < 4) {
              pcVar5 = STRING_c_str(handle_00);
              iVar1 = send_http_request(http_api_handle,pcVar5,request_header,blobBuffer,
                                        response_buff);
              if (iVar1 == 0) {
LAB_001283e7:
                puVar4 = BUFFER_u_char(response_buff);
                sVar3 = BUFFER_length(response_buff);
                handle_02 = STRING_from_byte_array(puVar4,sVar3);
                if (handle_02 == (STRING_HANDLE)0x0) {
                  p_Var2 = xlogging_get_log_function();
                  if (p_Var2 != (LOGGER_LOG)0x0) {
                    pcVar5 = "unable to get the response as string";
                    iVar1 = 0x240;
                    goto LAB_001285f3;
                  }
                }
                else {
                  STRING_c_str(handle_02);
                  value = json_parse_string((char *)0x128421);
                  if (value == (JSON_Value *)0x0) {
                    p_Var2 = xlogging_get_log_function();
                    if (p_Var2 != (LOGGER_LOG)0x0) {
                      (*p_Var2)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                                ,"parseResultFromIoTHub",0xb4,1,"unable to json_parse_string");
                    }
                  }
                  else {
                    object = json_value_get_object(value);
                    if (object == (JSON_Object *)0x0) {
                      p_Var2 = xlogging_get_log_function();
                      if (p_Var2 != (LOGGER_LOG)0x0) {
                        pcVar5 = "unable to get json_value_get_object";
                        iVar1 = 0xbc;
LAB_001287a3:
                        (*p_Var2)(AZ_LOG_ERROR,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                                  ,"parseResultFromIoTHub",iVar1,1,pcVar5);
                      }
                    }
                    else {
                      pcVar5 = json_object_get_string(object,"correlationId");
                      if (pcVar5 == (char *)0x0) {
                        p_Var2 = xlogging_get_log_function();
                        if (p_Var2 != (LOGGER_LOG)0x0) {
                          pcVar5 = "unable to retrieve correlation Id from json";
                          iVar1 = 0xca;
                          goto LAB_001287a3;
                        }
                      }
                      else {
                        pcVar6 = json_object_get_string(object,"hostName");
                        if (pcVar6 == (char *)0x0) {
                          p_Var2 = xlogging_get_log_function();
                          if (p_Var2 != (LOGGER_LOG)0x0) {
                            pcVar5 = "unable to retrieve hostname Id from json";
                            iVar1 = 0xcf;
                            goto LAB_001287a3;
                          }
                        }
                        else {
                          pcVar7 = json_object_get_string(object,"containerName");
                          if (pcVar7 == (char *)0x0) {
                            p_Var2 = xlogging_get_log_function();
                            if (p_Var2 != (LOGGER_LOG)0x0) {
                              pcVar5 = "unable to retrieve container name Id from json";
                              iVar1 = 0xd4;
                              goto LAB_001287a3;
                            }
                          }
                          else {
                            pcVar8 = json_object_get_string(object,"blobName");
                            if (pcVar8 == (char *)0x0) {
                              p_Var2 = xlogging_get_log_function();
                              if (p_Var2 != (LOGGER_LOG)0x0) {
                                pcVar5 = "unable to retrieve blob name Id from json";
                                iVar1 = 0xd9;
                                goto LAB_001287a3;
                              }
                            }
                            else {
                              pcVar9 = json_object_get_string(object,"sasToken");
                              if (pcVar9 == (char *)0x0) {
                                p_Var2 = xlogging_get_log_function();
                                if (p_Var2 != (LOGGER_LOG)0x0) {
                                  pcVar5 = "unable to retrieve sas token from json";
                                  iVar1 = 0xde;
                                  goto LAB_001287a3;
                                }
                              }
                              else {
                                handle_03 = URL_EncodeString(pcVar8);
                                if (handle_03 != (STRING_HANDLE)0x0) {
                                  handle_04 = STRING_new();
                                  if (handle_04 == (STRING_HANDLE)0x0) {
                                    p_Var2 = xlogging_get_log_function();
                                    if (p_Var2 != (LOGGER_LOG)0x0) {
                                      (*p_Var2)(AZ_LOG_ERROR,
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                                                ,"parseResultFromIoTHub",0xec,1,
                                                "Failed to allocate SAS URI STRING_HANDLE");
                                    }
                                  }
                                  else {
                                    pcVar8 = STRING_c_str(handle_03);
                                    iVar1 = STRING_sprintf(handle_04,"https://%s/%s/%s%s",pcVar6,
                                                           pcVar7,pcVar8,pcVar9);
                                    if (iVar1 == 0) {
                                      iVar1 = mallocAndStrcpy_s(uploadCorrelationId,pcVar5);
                                      if (iVar1 == 0) {
                                        pcVar5 = STRING_c_str(handle_04);
                                        iVar1 = mallocAndStrcpy_s(azureBlobSasUri,pcVar5);
                                        if (iVar1 == 0) {
                                          STRING_delete(handle_04);
                                          STRING_delete(handle_03);
                                          json_value_free(value);
                                          STRING_delete(handle_02);
                                          HTTPHeaders_Free(request_header);
                                          HTTPAPIEX_Destroy(http_api_handle);
                                          BUFFER_delete(response_buff);
                                          BUFFER_delete(blobBuffer);
                                          STRING_delete(handle_01);
                                          STRING_delete(handle_00);
                                          return IOTHUB_CLIENT_OK;
                                        }
                                        p_Var2 = xlogging_get_log_function();
                                        if (p_Var2 != (LOGGER_LOG)0x0) {
                                          (*p_Var2)(AZ_LOG_ERROR,
                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                                                  ,"parseResultFromIoTHub",0xfd,1,
                                                  "unable to copy SAS URI");
                                        }
                                        free(*uploadCorrelationId);
                                        *uploadCorrelationId = (char *)0x0;
                                      }
                                      else {
                                        p_Var2 = xlogging_get_log_function();
                                        if (p_Var2 != (LOGGER_LOG)0x0) {
                                          pcVar5 = "unable to copy correlation Id";
                                          iVar1 = 0xf8;
                                          goto LAB_001288df;
                                        }
                                      }
                                    }
                                    else {
                                      p_Var2 = xlogging_get_log_function();
                                      if (p_Var2 != (LOGGER_LOG)0x0) {
                                        pcVar5 = "unable to construct uri string";
                                        iVar1 = 0xf3;
LAB_001288df:
                                        (*p_Var2)(AZ_LOG_ERROR,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                                                  ,"parseResultFromIoTHub",iVar1,1,pcVar5);
                                      }
                                    }
                                    STRING_delete(handle_04);
                                  }
                                  STRING_delete(handle_03);
                                  json_value_free(value);
                                  goto LAB_001287b7;
                                }
                                p_Var2 = xlogging_get_log_function();
                                if (p_Var2 != (LOGGER_LOG)0x0) {
                                  pcVar5 = "unable to URL encode of filename";
                                  iVar1 = 0xe3;
                                  goto LAB_001287a3;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                    json_value_free(value);
                  }
LAB_001287b7:
                  p_Var2 = xlogging_get_log_function();
                  if (p_Var2 != (LOGGER_LOG)0x0) {
                    (*p_Var2)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                              ,"IoTHubClient_LL_UploadToBlob_GetBlobCredentialsFromIoTHub",0x247,1,
                              "unable to parse json result");
                  }
                  STRING_delete(handle_02);
                }
              }
              else {
                p_Var2 = xlogging_get_log_function();
                if (p_Var2 != (LOGGER_LOG)0x0) {
                  pcVar5 = "unable to HTTPAPIEX_ExecuteRequest";
                  iVar1 = 0x222;
LAB_001285f3:
                  (*p_Var2)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                            ,"IoTHubClient_LL_UploadToBlob_GetBlobCredentialsFromIoTHub",iVar1,1,
                            pcVar5);
                }
              }
            }
            else if (handle->cred_type == IOTHUB_CREDENTIAL_TYPE_DEVICE_KEY) {
              pcVar5 = STRING_c_str(handle_00);
              iVar1 = send_http_sas_request
                                (handle,http_api_handle,pcVar5,request_header,blobBuffer,
                                 response_buff);
              if (iVar1 == 0) goto LAB_001283e7;
              p_Var2 = xlogging_get_log_function();
              if (p_Var2 != (LOGGER_LOG)0x0) {
                pcVar5 = "unable to HTTPAPIEX_SAS_ExecuteRequest";
                iVar1 = 0x22e;
                goto LAB_001285f3;
              }
            }
            else {
              p_Var2 = xlogging_get_log_function();
              if (p_Var2 != (LOGGER_LOG)0x0) {
                (*p_Var2)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                          ,"IoTHubClient_LL_UploadToBlob_GetBlobCredentialsFromIoTHub",0x218,1,
                          "Internal Error: unexpected value in auth schema = %d",
                          (ulong)handle->cred_type);
              }
            }
            HTTPHeaders_Free(request_header);
          }
          HTTPAPIEX_Destroy(http_api_handle);
        }
        BUFFER_delete(response_buff);
      }
      BUFFER_delete(blobBuffer);
    }
    STRING_delete(handle_01);
  }
  STRING_delete(handle_00);
LAB_00128827:
  p_Var2 = xlogging_get_log_function();
  if (p_Var2 != (LOGGER_LOG)0x0) {
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
              ,"IoTHubClient_LL_UploadToBlob_InitializeUpload",0x393,1,
              "error in IoTHubClient_LL_UploadToBlob_GetBlobCredentialsFromIoTHub");
  }
  return IOTHUB_CLIENT_ERROR;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubClient_LL_UploadToBlob_InitializeUpload(IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE handle, const char* destinationFileName, char** uploadCorrelationId, char** azureBlobSasUri)
{
    IOTHUB_CLIENT_RESULT result;

    if (handle == NULL || destinationFileName == NULL || uploadCorrelationId == NULL || azureBlobSasUri == NULL)
    {
        LogError("invalid argument detected handle=%p destinationFileName=%p uploadCorrelationId=%p azureBlobSasUri=%p",
            handle, destinationFileName, uploadCorrelationId, azureBlobSasUri);
        result = IOTHUB_CLIENT_INVALID_ARG;
    }
    else
    {
        IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE_DATA* upload_data = (IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE_DATA*)handle;

        if (IoTHubClient_LL_UploadToBlob_GetBlobCredentialsFromIoTHub(
            upload_data, destinationFileName, uploadCorrelationId, azureBlobSasUri) != 0)
        {
            LogError("error in IoTHubClient_LL_UploadToBlob_GetBlobCredentialsFromIoTHub");
            result = IOTHUB_CLIENT_ERROR;
        }
        else
        {
            result = IOTHUB_CLIENT_OK;
        }
    }

    return result;
}